

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::SetLanguageEnabledMaps(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  bool bVar1;
  int iVar2;
  cmValue cVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  string *psVar6;
  mapped_type_conflict1 *pmVar7;
  string *i;
  pointer __k;
  string_view arg;
  string_view str;
  string_view prefix;
  int preference;
  allocator<char> local_132;
  allocator<char> local_131;
  string ignoreExts;
  string ignoreExtensionsVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extensionList;
  string linkerPrefVar;
  string outputExtensionVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = ::cm::
          contains<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&this->LanguageToLinkerPreference,l);
  if (!bVar1) {
    std::operator+(&outputExtensionVar,"CMAKE_",l);
    std::operator+(&linkerPrefVar,&outputExtensionVar,"_LINKER_PREFERENCE");
    std::__cxx11::string::~string((string *)&outputExtensionVar);
    cVar3 = cmMakefile::GetDefinition(mf,&linkerPrefVar);
    preference = 0;
    if ((cVar3.Value != (string *)0x0) && ((cVar3.Value)->_M_string_length != 0)) {
      iVar2 = __isoc99_sscanf(((cVar3.Value)->_M_dataplus)._M_p,"%d",&preference);
      if (iVar2 == 1) {
        if (preference < 0) {
          outputExtensionVar._M_dataplus._M_p = (pointer)linkerPrefVar._M_string_length;
          outputExtensionVar._M_string_length = (size_type)linkerPrefVar._M_dataplus._M_p;
          ignoreExtensionsVar._M_dataplus._M_p = (pointer)0x1f;
          ignoreExtensionsVar._M_string_length = (size_type)anon_var_dwarf_66cfd5;
          cmStrCat<>(&ignoreExts,(cmAlphaNum *)&outputExtensionVar,
                     (cmAlphaNum *)&ignoreExtensionsVar);
          cmSystemTools::Message(&ignoreExts,"Warning");
          preference = 0;
          std::__cxx11::string::~string((string *)&ignoreExts);
        }
      }
      else if (*((cVar3.Value)->_M_dataplus)._M_p == 'P') {
        preference = 100;
      }
      else {
        preference = 0;
      }
    }
    iVar2 = preference;
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&this->LanguageToLinkerPreference,l);
    *pmVar4 = iVar2;
    std::operator+(&ignoreExtensionsVar,"CMAKE_",l);
    std::operator+(&outputExtensionVar,&ignoreExtensionsVar,"_OUTPUT_EXTENSION");
    std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
    cVar3 = cmMakefile::GetDefinition(mf,&outputExtensionVar);
    if (cVar3.Value != (string *)0x0) {
      std::__cxx11::string::string((string *)&ignoreExtensionsVar,(string *)cVar3.Value);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->LanguageToOutputExtension,l);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&this->OutputExtensions,&ignoreExtensionsVar);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      str._M_str = ignoreExtensionsVar._M_dataplus._M_p;
      str._M_len = ignoreExtensionsVar._M_string_length;
      prefix._M_str = ".";
      prefix._M_len = 1;
      bVar1 = cmHasPrefix(str,prefix);
      if (bVar1) {
        std::__cxx11::string::substr((ulong)&ignoreExts,(ulong)&ignoreExtensionsVar);
        std::__cxx11::string::operator=((string *)&ignoreExtensionsVar,(string *)&ignoreExts);
        std::__cxx11::string::~string((string *)&ignoreExts);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&this->OutputExtensions,&ignoreExtensionsVar);
        std::__cxx11::string::_M_assign((string *)pmVar5);
      }
      std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
    }
    FillExtensionToLanguageMap(this,l,mf);
    std::__cxx11::string::string<std::allocator<char>>((string *)&extensionList,"CMAKE_",&local_131)
    ;
    std::__cxx11::string::string((string *)&local_50,(string *)l);
    std::operator+(&ignoreExts,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &extensionList,&local_50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"_IGNORE_EXTENSIONS",&local_132);
    std::operator+(&ignoreExtensionsVar,&ignoreExts,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&ignoreExts);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&extensionList);
    psVar6 = cmMakefile::GetSafeDefinition(mf,&ignoreExtensionsVar);
    std::__cxx11::string::string((string *)&ignoreExts,(string *)psVar6);
    arg._M_str = ignoreExts._M_dataplus._M_p;
    arg._M_len = ignoreExts._M_string_length;
    cmExpandedList_abi_cxx11_(&extensionList,arg,false);
    for (__k = extensionList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        __k != extensionList.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
               ::operator[](&this->IgnoreExtensions,__k);
      *pmVar7 = true;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&extensionList);
    std::__cxx11::string::~string((string *)&ignoreExts);
    std::__cxx11::string::~string((string *)&ignoreExtensionsVar);
    std::__cxx11::string::~string((string *)&outputExtensionVar);
    std::__cxx11::string::~string((string *)&linkerPrefVar);
  }
  return;
}

Assistant:

void cmGlobalGenerator::SetLanguageEnabledMaps(const std::string& l,
                                               cmMakefile* mf)
{
  // use LanguageToLinkerPreference to detect whether this functions has
  // run before
  if (cm::contains(this->LanguageToLinkerPreference, l)) {
    return;
  }

  std::string linkerPrefVar = "CMAKE_" + l + "_LINKER_PREFERENCE";
  cmValue linkerPref = mf->GetDefinition(linkerPrefVar);
  int preference = 0;
  if (cmNonempty(linkerPref)) {
    if (sscanf(linkerPref->c_str(), "%d", &preference) != 1) {
      // backward compatibility: before 2.6 LINKER_PREFERENCE
      // was either "None" or "Preferred", and only the first character was
      // tested. So if there is a custom language out there and it is
      // "Preferred", set its preference high
      if ((*linkerPref)[0] == 'P') {
        preference = 100;
      } else {
        preference = 0;
      }
    }
  }

  if (preference < 0) {
    std::string msg =
      cmStrCat(linkerPrefVar, " is negative, adjusting it to 0");
    cmSystemTools::Message(msg, "Warning");
    preference = 0;
  }

  this->LanguageToLinkerPreference[l] = preference;

  std::string outputExtensionVar = "CMAKE_" + l + "_OUTPUT_EXTENSION";
  if (cmValue p = mf->GetDefinition(outputExtensionVar)) {
    std::string outputExtension = *p;
    this->LanguageToOutputExtension[l] = outputExtension;
    this->OutputExtensions[outputExtension] = outputExtension;
    if (cmHasPrefix(outputExtension, ".")) {
      outputExtension = outputExtension.substr(1);
      this->OutputExtensions[outputExtension] = outputExtension;
    }
  }

  // The map was originally filled by SetLanguageEnabledFlag, but
  // since then the compiler- and platform-specific files have been
  // loaded which might have added more entries.
  this->FillExtensionToLanguageMap(l, mf);

  std::string ignoreExtensionsVar =
    std::string("CMAKE_") + std::string(l) + std::string("_IGNORE_EXTENSIONS");
  std::string ignoreExts = mf->GetSafeDefinition(ignoreExtensionsVar);
  std::vector<std::string> extensionList = cmExpandedList(ignoreExts);
  for (std::string const& i : extensionList) {
    this->IgnoreExtensions[i] = true;
  }
}